

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O3

void publickey_status_error(LIBSSH2_PUBLICKEY *pkey,LIBSSH2_SESSION *session,unsigned_long status)

{
  char *errmsg;
  
  if (pkey == (LIBSSH2_PUBLICKEY *)0x0 || status != 6) {
    if (8 < status) {
      errmsg = "unknown";
      goto LAB_0011f942;
    }
  }
  else {
    status = (ulong)(pkey->version == 1) | 6;
  }
  errmsg = publickey_status_codes[status].name;
LAB_0011f942:
  _libssh2_error(session,-0x24,errmsg);
  return;
}

Assistant:

static void
publickey_status_error(const LIBSSH2_PUBLICKEY *pkey,
                       LIBSSH2_SESSION *session, unsigned long status)
{
    const char *msg;

    /* GENERAL_FAILURE got remapped between version 1 and 2 */
    if(status == 6 && pkey && pkey->version == 1) {
        status = 7;
    }

    if(status > LIBSSH2_PUBLICKEY_STATUS_CODE_MAX) {
        msg = "unknown";
    }
    else {
        msg = publickey_status_codes[status].name;
    }

    _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL, msg);
}